

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_lcl.c
# Opt level: O0

void beltBlockAddBitSizeU32(u32 *block,size_t count)

{
  u32 uVar1;
  uint uVar2;
  uint uVar3;
  size_t t;
  u32 carry;
  size_t count_local;
  u32 *block_local;
  
  uVar2 = (int)count * 8;
  uVar3 = uVar2 + *block;
  *block = uVar3;
  carry = (u32)(uVar3 < uVar2);
  uVar1 = block[1];
  block[1] = carry + uVar1;
  uVar2 = (uint)(count >> 0x1d);
  if (carry + uVar1 < carry) {
    block[1] = uVar2;
  }
  else {
    uVar1 = block[1];
    block[1] = uVar2 + uVar1;
    carry = (u32)(uVar2 + uVar1 < uVar2);
  }
  uVar1 = block[2];
  block[2] = carry + uVar1;
  uVar2 = (uint)(count >> 0x3d);
  if (carry + uVar1 < carry) {
    block[2] = uVar2;
  }
  else {
    uVar1 = block[2];
    block[2] = uVar2 + uVar1;
    carry = (u32)(uVar2 + uVar1 < uVar2);
  }
  block[3] = carry + block[3];
  block[3] = block[3];
  return;
}

Assistant:

void beltBlockAddBitSizeU32(u32 block[4], size_t count)
{
	// block <- block + 8 * count
	register u32 carry = (u32)count << 3;
#if (B_PER_S < 32)
	carry = (block[0] += carry) < carry;
	carry = (block[1] += carry) < carry;
	carry = (block[2] += carry) < carry;
	block[3] += carry;
#else
	register size_t t = count >> 29;
	carry = (block[0] += carry) < carry;
	if ((block[1] += carry) < carry)
		block[1] = (u32)t;
	else
		carry = (block[1] += (u32)t) < (u32)t;
	t >>= 16, t >>= 16;
	if ((block[2] += carry) < carry)
		block[2] = (u32)t;
	else
		carry = (block[2] += (u32)t) < (u32)t;
	t >>= 16, t >>= 16;
	block[3] += carry;
	block[3] += (u32)t;
	t = 0;
#endif
	carry = 0;
}